

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int VecSNode_equal(VecSNode *vsn1,VecSNode *vsn2)

{
  uint local_28;
  uint local_24;
  uint j;
  uint i;
  VecSNode *vsn2_local;
  VecSNode *vsn1_local;
  
  if (vsn1->n == vsn2->n) {
    for (local_24 = 0; local_24 < vsn1->n; local_24 = local_24 + 1) {
      for (local_28 = 0; (local_28 < vsn2->n && (vsn1->v[local_24] != vsn2->v[local_28]));
          local_28 = local_28 + 1) {
      }
      if (vsn2->n <= local_28) {
        return 0;
      }
    }
    vsn1_local._4_4_ = 1;
  }
  else {
    vsn1_local._4_4_ = 0;
  }
  return vsn1_local._4_4_;
}

Assistant:

static int VecSNode_equal(VecSNode *vsn1, VecSNode *vsn2) {
  uint i, j;
  if (vsn1->n != vsn2->n) return 0;
  for (i = 0; i < vsn1->n; i++) {
    for (j = 0; j < vsn2->n; j++) {
      if (vsn1->v[i] == vsn2->v[j]) break;
    }
    if (j >= vsn2->n) return 0;
  }
  return 1;
}